

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O0

int gdImageContrast(gdImagePtr src,double contrast)

{
  uint uVar1;
  code *pcVar2;
  double dVar3;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  FuncPtr f;
  int pxl;
  int new_pxl;
  double bf;
  double gf;
  double rf;
  int a;
  int b;
  int g;
  int r;
  int y;
  int x;
  double contrast_local;
  gdImagePtr src_local;
  
  if (src == (gdImagePtr)0x0) {
    src_local._4_4_ = 0;
  }
  else {
    pcVar2 = gdImageGetPixel;
    if (src->trueColor != 0) {
      pcVar2 = gdImageGetTrueColorPixel;
    }
    dVar3 = (100.0 - contrast) / 100.0;
    dVar3 = dVar3 * dVar3;
    for (g = 0; g < src->sy; g = g + 1) {
      for (r = 0; r < src->sx; r = r + 1) {
        uVar1 = (*pcVar2)(src,r,g);
        if (src->trueColor == 0) {
          local_64 = src->red[(int)uVar1];
        }
        else {
          local_64 = (int)(uVar1 & 0xff0000) >> 0x10;
        }
        if (src->trueColor == 0) {
          local_68 = src->green[(int)uVar1];
        }
        else {
          local_68 = (int)(uVar1 & 0xff00) >> 8;
        }
        if (src->trueColor == 0) {
          local_6c = src->blue[(int)uVar1];
        }
        else {
          local_6c = uVar1 & 0xff;
        }
        if (src->trueColor == 0) {
          local_70 = src->alpha[(int)uVar1];
        }
        else {
          local_70 = (int)(uVar1 & 0x7f000000) >> 0x18;
        }
        local_80 = (((double)local_64 / 255.0 - 0.5) * dVar3 + 0.5) * 255.0;
        local_a0 = (((double)(int)local_6c / 255.0 - 0.5) * dVar3 + 0.5) * 255.0;
        local_90 = (((double)local_68 / 255.0 - 0.5) * dVar3 + 0.5) * 255.0;
        if (local_80 <= 255.0) {
          if (local_80 < 0.0) {
            local_80 = 0.0;
          }
          local_78 = local_80;
        }
        else {
          local_78 = 255.0;
        }
        if (local_90 <= 255.0) {
          if (local_90 < 0.0) {
            local_90 = 0.0;
          }
          local_88 = local_90;
        }
        else {
          local_88 = 255.0;
        }
        if (local_a0 <= 255.0) {
          if (local_a0 < 0.0) {
            local_a0 = 0.0;
          }
          local_98 = local_a0;
        }
        else {
          local_98 = 255.0;
        }
        f._4_4_ = gdImageColorAllocateAlpha(src,(int)local_78,(int)local_88,(int)local_98,local_70);
        if (f._4_4_ == -1) {
          f._4_4_ = gdImageColorClosestAlpha(src,(int)local_78,(int)local_88,(int)local_98,local_70)
          ;
        }
        gdImageSetPixel(src,r,g,f._4_4_);
      }
    }
    src_local._4_4_ = 1;
  }
  return src_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageContrast(gdImagePtr src, double contrast)
{
	int x, y;
	int r,g,b,a;
	double rf,gf,bf;
	int new_pxl, pxl;

	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	f = GET_PIXEL_FUNCTION(src);

	contrast = (double)(100.0-contrast)/100.0;
	contrast = contrast*contrast;

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			pxl = f(src, x, y);

			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);

			rf = (double)r/255.0;
			rf = rf-0.5;
			rf = rf*contrast;
			rf = rf+0.5;
			rf = rf*255.0;

			bf = (double)b/255.0;
			bf = bf-0.5;
			bf = bf*contrast;
			bf = bf+0.5;
			bf = bf*255.0;

			gf = (double)g/255.0;
			gf = gf-0.5;
			gf = gf*contrast;
			gf = gf+0.5;
			gf = gf*255.0;

			rf = (rf > 255.0)? 255.0 : ((rf < 0.0)? 0.0:rf);
			gf = (gf > 255.0)? 255.0 : ((gf < 0.0)? 0.0:gf);
			bf = (bf > 255.0)? 255.0 : ((bf < 0.0)? 0.0:bf);

			new_pxl = gdImageColorAllocateAlpha(src, (int)rf, (int)gf, (int)bf, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)rf, (int)gf, (int)bf, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}